

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O0

void __thiscall
TPZAdmChunkVector<TPZCompEl_*,_10>::SetFree(TPZAdmChunkVector<TPZCompEl_*,_10> *this,int index)

{
  int iVar1;
  ostream *this_00;
  int *piVar2;
  int in_ESI;
  long in_RDI;
  int chunk;
  
  if (in_ESI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "TPZAdmChunkVector::SetFree. Bad parameter index.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else {
    iVar1 = in_ESI >> 10;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x88),(long)iVar1);
    *piVar2 = *piVar2 + 1;
    TPZStack<int,_10>::Push
              ((TPZStack<int,_10> *)CONCAT44(in_ESI,iVar1),(int)((ulong)in_RDI >> 0x20));
    if (*(int *)(in_RDI + 0x80) == 2) {
      CompactDataStructure(this,index);
    }
  }
  return;
}

Assistant:

void TPZAdmChunkVector<T, EXP>::SetFree(int index) {
#ifndef PZNODEBUG
    if (index < 0) {
        PZError << "TPZAdmChunkVector::SetFree. Bad parameter index." << std::endl;
        PZError.flush();
        return;
    }
#endif

    int chunk = index >> EXP;

    fNFree[chunk]++;
    fFree.Push(index);

    if (fCompactScheme == ALWAYS) {
        CompactDataStructure(ALWAYS);
}
}